

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O3

void __thiscall
duckdb::Connection::Append(Connection *this,TableDescription *description,DataChunk *chunk)

{
  type pCVar1;
  type pDVar2;
  type allocator_p;
  ClientContext *this_00;
  ColumnDataCollection collection;
  vector<duckdb::LogicalType,_true> local_b0;
  ColumnDataCollection local_98;
  
  if (chunk->count != 0) {
    pCVar1 = shared_ptr<duckdb::ClientContext,_true>::operator*(&this->context);
    pDVar2 = shared_ptr<duckdb::DatabaseInstance,_true>::operator*(&pCVar1->db);
    allocator_p = unique_ptr<duckdb::Allocator,_std::default_delete<duckdb::Allocator>,_true>::
                  operator*(&(pDVar2->config).allocator);
    DataChunk::GetTypes(&local_b0,chunk);
    ColumnDataCollection::ColumnDataCollection(&local_98,allocator_p,&local_b0);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_b0);
    ColumnDataCollection::Append(&local_98,chunk);
    this_00 = shared_ptr<duckdb::ClientContext,_true>::operator->(&this->context);
    ClientContext::Append
              (this_00,description,&local_98,
               (optional_ptr<const_duckdb::vector<duckdb::LogicalIndex,_true>,_true>)0x0);
    ColumnDataCollection::~ColumnDataCollection(&local_98);
  }
  return;
}

Assistant:

void Connection::Append(TableDescription &description, DataChunk &chunk) {
	if (chunk.size() == 0) {
		return;
	}
	ColumnDataCollection collection(Allocator::Get(*context), chunk.GetTypes());
	collection.Append(chunk);
	Append(description, collection);
}